

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::DescriptorScriptPubKeyMan::SignTransaction
          (DescriptorScriptPubKeyMan *this,CMutableTransaction *tx,
          map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          *coins,int sighash,
          map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
          *input_errors)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  FlatSigningProvider *__s;
  _Base_ptr p_Var3;
  long in_FS_OFFSET;
  undefined1 local_48 [8];
  FlatSigningProvider *local_40;
  signal_base local_38;
  
  local_38._vptr_signal_base = *(_func_int ***)(in_FS_OFFSET + 0x28);
  __s = (FlatSigningProvider *)operator_new(0xf8);
  memset(__s,0,0xe0);
  (__s->super_SigningProvider)._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_00b049b0;
  p_Var1 = &(__s->scripts)._M_t._M_impl.super__Rb_tree_header;
  (__s->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__s->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(__s->pubkeys)._M_t._M_impl.super__Rb_tree_header;
  (__s->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__s->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(__s->origins)._M_t._M_impl.super__Rb_tree_header;
  (__s->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__s->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(__s->keys)._M_t._M_impl.super__Rb_tree_header;
  (__s->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__s->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(__s->tr_trees)._M_t._M_impl.super__Rb_tree_header;
  (__s->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__s->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__s->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (coins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(coins->_M_t)._M_impl.super__Rb_tree_header;
  local_40 = __s;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      GetSigningProvider((DescriptorScriptPubKeyMan *)local_48,(CScript *)this,
                         (bool)((char)p_Var3 + 'P'));
      if ((local_48 != (undefined1  [8])0x0) &&
         (FlatSigningProvider::Merge(local_40,(FlatSigningProvider *)local_48),
         local_48 != (undefined1  [8])0x0)) {
        std::default_delete<FlatSigningProvider>::operator()
                  ((default_delete<FlatSigningProvider> *)local_48,(FlatSigningProvider *)local_48);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  bVar2 = ::SignTransaction(tx,&local_40->super_SigningProvider,coins,sighash,input_errors);
  if (local_40 != (FlatSigningProvider *)0x0) {
    std::default_delete<FlatSigningProvider>::operator()
              ((default_delete<FlatSigningProvider> *)&local_40,local_40);
  }
  if (*(_func_int ***)(in_FS_OFFSET + 0x28) != local_38._vptr_signal_base) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool DescriptorScriptPubKeyMan::SignTransaction(CMutableTransaction& tx, const std::map<COutPoint, Coin>& coins, int sighash, std::map<int, bilingual_str>& input_errors) const
{
    std::unique_ptr<FlatSigningProvider> keys = std::make_unique<FlatSigningProvider>();
    for (const auto& coin_pair : coins) {
        std::unique_ptr<FlatSigningProvider> coin_keys = GetSigningProvider(coin_pair.second.out.scriptPubKey, true);
        if (!coin_keys) {
            continue;
        }
        keys->Merge(std::move(*coin_keys));
    }

    return ::SignTransaction(tx, keys.get(), coins, sighash, input_errors);
}